

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue.h
# Opt level: O3

iterator * __thiscall
bidfx_public_api::tools::BlockingQueue<bidfx_public_api::price::pixie::AckData>::Pop
          (iterator *__return_storage_ptr__,
          BlockingQueue<bidfx_public_api::price::pixie::AckData> *this)

{
  _Elt_pointer pAVar1;
  _Elt_pointer pAVar2;
  _Elt_pointer pAVar3;
  _Map_pointer ppAVar4;
  unique_lock<std::mutex> lock;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pAVar1 = (this->queue_).
           super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pAVar3 = (this->queue_).
           super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar3 == pAVar1) {
    local_38 = *(undefined4 *)
                &(this->queue_).
                 super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
    uStack_34 = *(undefined4 *)
                 ((long)&(this->queue_).
                         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
    uStack_30 = *(undefined4 *)
                 &(this->queue_).
                  super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last;
    uStack_2c = *(undefined4 *)
                 ((long)&(this->queue_).
                         super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
    ppAVar4 = (this->queue_).
              super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  }
  else {
    pAVar3 = (this->queue_).
             super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
    pAVar2 = (this->queue_).
             super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppAVar4 = (this->queue_).
              super__Deque_base<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    std::
    deque<bidfx_public_api::price::pixie::AckData,_std::allocator<bidfx_public_api::price::pixie::AckData>_>
    ::pop_front(&this->queue_);
    local_38 = SUB84(pAVar3,0);
    uStack_34 = (undefined4)((ulong)pAVar3 >> 0x20);
    uStack_30 = SUB84(pAVar2,0);
    uStack_2c = (undefined4)((ulong)pAVar2 >> 0x20);
    pAVar3 = pAVar1;
  }
  __return_storage_ptr__->_M_cur = pAVar3;
  *(undefined4 *)&__return_storage_ptr__->_M_first = local_38;
  *(undefined4 *)((long)&__return_storage_ptr__->_M_first + 4) = uStack_34;
  *(undefined4 *)&__return_storage_ptr__->_M_last = uStack_30;
  *(undefined4 *)((long)&__return_storage_ptr__->_M_last + 4) = uStack_2c;
  __return_storage_ptr__->_M_node = ppAVar4;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<T>::iterator Pop()
    {
        std::unique_lock<std::mutex> lock(mutex_);

        if (queue_.empty())
        {
            return queue_.end();
        }

        auto element = queue_.begin();
        queue_.pop_front();
        return element;
    }